

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::reset(Synth *this)

{
  int local_14;
  int i;
  Synth *this_local;
  
  if ((this->opened & 1U) != 0) {
    (*this->reportHandler->_vptr_ReportHandler[9])();
    PartialManager::deactivateAll(this->partialManager);
    memcpy(this->mt32ram,this->mt32default,0x10dab);
    for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
      Part::reset(this->parts[local_14]);
      if (local_14 == 8) {
        (*this->parts[8]->_vptr_Part[6])();
      }
      else {
        (*this->parts[local_14]->_vptr_Part[5])
                  (this->parts[local_14],
                   (ulong)this->controlROMData
                          [(int)((uint)this->controlROMMap->programSettings + local_14)]);
      }
    }
    refreshSystem(this);
    resetMasterTunePitchDelta(this);
    isActive(this);
  }
  return;
}

Assistant:

void Synth::reset() {
	if (!opened) return;
#if MT32EMU_MONITOR_SYSEX > 0
	printDebug("RESET");
#endif
	reportHandler->onDeviceReset();
	partialManager->deactivateAll();
	mt32ram = mt32default;
	for (int i = 0; i < 9; i++) {
		parts[i]->reset();
		if (i != 8) {
			parts[i]->setProgram(controlROMData[controlROMMap->programSettings + i]);
		} else {
			parts[8]->refresh();
		}
	}
	refreshSystem();
	resetMasterTunePitchDelta();
	isActive();
}